

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_quadratic.h
# Opt level: O3

longdouble * __thiscall
mp::QuadAndLinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
          (longdouble *__return_storage_ptr__,QuadAndLinTerms *this,
          vector<double,_std::allocator<double>_> *x)

{
  longdouble *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(__return_storage_ptr__ + 1);
  if (lVar2 != 0) {
    x = *(vector<double,_std::allocator<double>_> **)((long)__return_storage_ptr__ + 0x48);
    do {
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  plVar1 = QuadTerms::ComputeValue<std::vector<double,std::allocator<double>>>
                     ((longdouble *)((long)__return_storage_ptr__ + 0x78),(QuadTerms *)this,x);
  return plVar1;
}

Assistant:

long double ComputeValue(const VarInfo& x) const {
    return LinTerms::ComputeValue(x) + QuadTerms::ComputeValue(x);
  }